

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::compute_filtration_t::compute_filtration_t
          (compute_filtration_t *this,filtration_algorithm_t *_filtration_algorithm,
          filtered_directed_graph_t *_graph,
          vector<float,_std::allocator<float>_> *_current_filtration,
          vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
          *_cell_hash,size_t nb_threads,size_t *_cell_hash_offsets)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  *in_RDI = 0xffffffff;
  *(undefined8 *)(in_RDI + 2) = in_RDX;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = in_RSI;
  *(undefined8 *)(in_RDI + 8) = in_RCX;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1a6cb2);
  *(undefined8 *)(in_RDI + 0x10) = in_R8;
  *(undefined8 *)(in_RDI + 0x12) = in_R9;
  *(size_t *)(in_RDI + 0x14) = nb_threads;
  return;
}

Assistant:

compute_filtration_t(filtration_algorithm_t* _filtration_algorithm, const filtered_directed_graph_t& _graph,
	                     const std::vector<value_t>& _current_filtration, std::vector<cell_hash_map_t>& _cell_hash,
	                     const size_t nb_threads, size_t* _cell_hash_offsets = nullptr)
	    : graph(_graph), filtration_algorithm(_filtration_algorithm), current_filtration(_current_filtration),
	      cell_hash(_cell_hash), nb_threads(nb_threads), cell_hash_offsets(_cell_hash_offsets) {}